

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.cpp
# Opt level: O2

int __thiscall
FName::NameManager::FindName(NameManager *this,char *text,size_t textLen,bool noCreate)

{
  NameEntry *pNVar1;
  char *__s1;
  uint hash;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  
  if (!Inited) {
    InitBuckets(this);
  }
  if (text != (char *)0x0) {
    hash = MakeKey(text,textLen);
    piVar4 = this->Buckets + (hash & 0x3ff);
    pNVar1 = this->NameArray;
    while( true ) {
      iVar3 = *piVar4;
      lVar5 = (long)iVar3;
      if (lVar5 < 0) break;
      if (pNVar1[lVar5].Hash == hash) {
        __s1 = pNVar1[lVar5].Text;
        iVar2 = strncasecmp(__s1,text,textLen);
        if ((iVar2 == 0) && (__s1[textLen] == '\0')) {
          return iVar3;
        }
      }
      piVar4 = &pNVar1[lVar5].NextHash;
    }
    if (!noCreate) {
      iVar3 = AddName(this,text,hash,hash & 0x3ff);
      return iVar3;
    }
  }
  return 0;
}

Assistant:

int FName::NameManager::FindName (const char *text, size_t textLen, bool noCreate)
{
	if (!Inited)
	{
		InitBuckets ();
	}

	if (text == NULL)
	{
		return 0;
	}

	unsigned int hash = MakeKey (text, textLen);
	unsigned int bucket = hash % HASH_SIZE;
	int scanner = Buckets[bucket];

	// See if the name already exists.
	while (scanner >= 0)
	{
		if (NameArray[scanner].Hash == hash &&
			strnicmp (NameArray[scanner].Text, text, textLen) == 0 &&
			NameArray[scanner].Text[textLen] == '\0')
		{
			return scanner;
		}
		scanner = NameArray[scanner].NextHash;
	}

	// If we get here, then the name does not exist.
	if (noCreate)
	{
		return 0;
	}

	return AddName (text, hash, bucket);
}